

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O0

Fl_Double_Window * make_sourceview(void)

{
  Fl_Fontsize FVar1;
  Fl_Widget *pFVar2;
  Fl_Tabs *this;
  Fl_Group *pFVar3;
  Fl_Text_Display *pFVar4;
  Fl_Group *pFVar5;
  Fl_Button *pFVar6;
  Fl_Box *o_8;
  Fl_Button *o_7;
  Fl_Light_Button *o_6;
  Fl_Button *o_5;
  Fl_Group *o_4;
  CodeViewer *o_3;
  Fl_Group *o_2;
  CodeViewer *o_1;
  Fl_Group *o;
  
  pFVar2 = (Fl_Widget *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)pFVar2,0x208,0x1ea,"Code View");
  sourceview_panel = (Fl_Double_Window *)pFVar2;
  Fl_Widget::callback(pFVar2,toggle_sourceview_cb);
  Fl_Widget::align((Fl_Widget *)sourceview_panel,0x50);
  this = (Fl_Tabs *)operator_new(200);
  Fl_Tabs::Fl_Tabs(this,10,10,500,0x1b8,(char *)0x0);
  sv_tab = this;
  Fl_Widget::selection_color((Fl_Widget *)this,4);
  Fl_Widget::labelcolor((Fl_Widget *)sv_tab,7);
  Fl_Widget::callback((Fl_Widget *)sv_tab,update_sourceview_position_cb);
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,0x23,500,0x19f,"Source");
  Fl_Widget::labelsize((Fl_Widget *)pFVar3,0xd);
  pFVar4 = (Fl_Text_Display *)operator_new(0x1c0);
  CodeViewer::CodeViewer((CodeViewer *)pFVar4,0x14,0x32,0x1e0,0x186,(char *)0x0);
  sv_source = (CodeViewer *)pFVar4;
  Fl_Widget::box((Fl_Widget *)pFVar4,FL_DOWN_FRAME);
  Fl_Widget::color((Fl_Widget *)sv_source,7);
  Fl_Widget::selection_color((Fl_Widget *)sv_source,0xf);
  Fl_Widget::labeltype((Fl_Widget *)sv_source,FL_NORMAL_LABEL);
  Fl_Widget::labelfont((Fl_Widget *)sv_source,0);
  Fl_Widget::labelsize((Fl_Widget *)sv_source,0xe);
  Fl_Widget::labelcolor((Fl_Widget *)sv_source,0);
  Fl_Text_Display::textfont((Fl_Text_Display *)sv_source,4);
  CodeEditor::textsize(&sv_source->super_CodeEditor,0xb);
  Fl_Widget::align((Fl_Widget *)sv_source,1);
  Fl_Widget::when((Fl_Widget *)sv_source,'\x04');
  pFVar5 = Fl_Group::current();
  Fl_Group::resizable(pFVar5,(Fl_Widget *)sv_source);
  Fl_Text_Display::linenumber_width(pFVar4,0x3c);
  FVar1 = Fl_Text_Display::textsize(pFVar4);
  Fl_Text_Display::linenumber_size(pFVar4,FVar1);
  Fl_Group::end(pFVar3);
  pFVar5 = Fl_Group::current();
  Fl_Group::resizable(pFVar5,(Fl_Widget *)pFVar3);
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,0x23,500,0x19f,"Header");
  Fl_Widget::labelsize((Fl_Widget *)pFVar3,0xd);
  (*(pFVar3->super_Fl_Widget)._vptr_Fl_Widget[6])();
  pFVar4 = (Fl_Text_Display *)operator_new(0x1c0);
  CodeViewer::CodeViewer((CodeViewer *)pFVar4,0x14,0x32,0x1e0,0x186,(char *)0x0);
  sv_header = (CodeViewer *)pFVar4;
  Fl_Widget::box((Fl_Widget *)pFVar4,FL_DOWN_FRAME);
  Fl_Widget::color((Fl_Widget *)sv_header,7);
  Fl_Widget::selection_color((Fl_Widget *)sv_header,0xf);
  Fl_Widget::labeltype((Fl_Widget *)sv_header,FL_NORMAL_LABEL);
  Fl_Widget::labelfont((Fl_Widget *)sv_header,0);
  Fl_Widget::labelsize((Fl_Widget *)sv_header,0xe);
  Fl_Widget::labelcolor((Fl_Widget *)sv_header,0);
  Fl_Text_Display::textfont((Fl_Text_Display *)sv_header,4);
  CodeEditor::textsize(&sv_header->super_CodeEditor,0xb);
  Fl_Widget::align((Fl_Widget *)sv_header,1);
  Fl_Widget::when((Fl_Widget *)sv_header,'\x04');
  pFVar5 = Fl_Group::current();
  Fl_Group::resizable(pFVar5,(Fl_Widget *)sv_header);
  Fl_Text_Display::linenumber_width(pFVar4,0x3c);
  FVar1 = Fl_Text_Display::textsize(pFVar4);
  Fl_Text_Display::linenumber_size(pFVar4,FVar1);
  Fl_Group::end(pFVar3);
  Fl_Group::end(&sv_tab->super_Fl_Group);
  pFVar3 = Fl_Group::current();
  Fl_Group::resizable(pFVar3,(Fl_Widget *)sv_tab);
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,0x1cc,500,0x14,(char *)0x0);
  pFVar6 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar6,10,0x1cc,0x3d,0x14,"Refresh");
  Fl_Widget::labelsize((Fl_Widget *)pFVar6,0xb);
  Fl_Widget::callback((Fl_Widget *)pFVar6,update_sourceview_cb);
  pFVar2 = (Fl_Widget *)operator_new(0x80);
  Fl_Light_Button::Fl_Light_Button((Fl_Light_Button *)pFVar2,0x4c,0x1cc,0x5b,0x14,"Auto-Refresh");
  sv_autorefresh = (Fl_Light_Button *)pFVar2;
  Fl_Widget::labelsize(pFVar2,0xb);
  Fl_Widget::callback(pFVar2,update_sourceview_cb);
  pFVar2 = (Fl_Widget *)operator_new(0x80);
  Fl_Light_Button::Fl_Light_Button((Fl_Light_Button *)pFVar2,0xac,0x1cc,0x59,0x14,"Auto-Position");
  sv_autoposition = (Fl_Light_Button *)pFVar2;
  Fl_Widget::labelsize(pFVar2,0xb);
  pFVar6 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar6,0x1cc,0x1cc,0x32,0x14,"Close");
  Fl_Widget::labelsize((Fl_Widget *)pFVar6,0xb);
  Fl_Widget::callback((Fl_Widget *)pFVar6,toggle_sourceview_b_cb);
  pFVar2 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar2,0x109,0x1cc,0xbe,0x14,(char *)0x0);
  pFVar5 = Fl_Group::current();
  Fl_Group::resizable(pFVar5,pFVar2);
  Fl_Group::end(pFVar3);
  Fl_Window::size_range(&sourceview_panel->super_Fl_Window,0x180,0x78,0,0,0,0,0);
  Fl_Group::end((Fl_Group *)sourceview_panel);
  return sourceview_panel;
}

Assistant:

Fl_Double_Window* make_sourceview() {
  { sourceview_panel = new Fl_Double_Window(520, 490, "Code View");
    sourceview_panel->callback((Fl_Callback*)toggle_sourceview_cb);
    sourceview_panel->align(Fl_Align(FL_ALIGN_CLIP|FL_ALIGN_INSIDE));
    { sv_tab = new Fl_Tabs(10, 10, 500, 440);
      sv_tab->selection_color((Fl_Color)4);
      sv_tab->labelcolor(FL_BACKGROUND2_COLOR);
      sv_tab->callback((Fl_Callback*)update_sourceview_position_cb);
      { Fl_Group* o = new Fl_Group(10, 35, 500, 415, "Source");
        o->labelsize(13);
        { CodeViewer* o = sv_source = new CodeViewer(20, 50, 480, 390);
          sv_source->box(FL_DOWN_FRAME);
          sv_source->color(FL_BACKGROUND2_COLOR);
          sv_source->selection_color(FL_SELECTION_COLOR);
          sv_source->labeltype(FL_NORMAL_LABEL);
          sv_source->labelfont(0);
          sv_source->labelsize(14);
          sv_source->labelcolor(FL_FOREGROUND_COLOR);
          sv_source->textfont(4);
          sv_source->textsize(11);
          sv_source->align(Fl_Align(FL_ALIGN_TOP));
          sv_source->when(FL_WHEN_RELEASE);
          Fl_Group::current()->resizable(sv_source);
          o->linenumber_width(60);
          o->linenumber_size(o->Fl_Text_Display::textsize());
        } // CodeViewer* sv_source
        o->end();
        Fl_Group::current()->resizable(o);
      } // Fl_Group* o
      { Fl_Group* o = new Fl_Group(10, 35, 500, 415, "Header");
        o->labelsize(13);
        o->hide();
        { CodeViewer* o = sv_header = new CodeViewer(20, 50, 480, 390);
          sv_header->box(FL_DOWN_FRAME);
          sv_header->color(FL_BACKGROUND2_COLOR);
          sv_header->selection_color(FL_SELECTION_COLOR);
          sv_header->labeltype(FL_NORMAL_LABEL);
          sv_header->labelfont(0);
          sv_header->labelsize(14);
          sv_header->labelcolor(FL_FOREGROUND_COLOR);
          sv_header->textfont(4);
          sv_header->textsize(11);
          sv_header->align(Fl_Align(FL_ALIGN_TOP));
          sv_header->when(FL_WHEN_RELEASE);
          Fl_Group::current()->resizable(sv_header);
          o->linenumber_width(60);
          o->linenumber_size(o->Fl_Text_Display::textsize());
        } // CodeViewer* sv_header
        o->end();
      } // Fl_Group* o
      sv_tab->end();
      Fl_Group::current()->resizable(sv_tab);
    } // Fl_Tabs* sv_tab
    { Fl_Group* o = new Fl_Group(10, 460, 500, 20);
      { Fl_Button* o = new Fl_Button(10, 460, 61, 20, "Refresh");
        o->labelsize(11);
        o->callback((Fl_Callback*)update_sourceview_cb);
      } // Fl_Button* o
      { Fl_Light_Button* o = sv_autorefresh = new Fl_Light_Button(76, 460, 91, 20, "Auto-Refresh");
        sv_autorefresh->labelsize(11);
        o->callback((Fl_Callback*)update_sourceview_cb);
      } // Fl_Light_Button* sv_autorefresh
      { sv_autoposition = new Fl_Light_Button(172, 460, 89, 20, "Auto-Position");
        sv_autoposition->labelsize(11);
      } // Fl_Light_Button* sv_autoposition
      { Fl_Button* o = new Fl_Button(460, 460, 50, 20, "Close");
        o->labelsize(11);
        o->callback((Fl_Callback*)toggle_sourceview_b_cb);
      } // Fl_Button* o
      { Fl_Box* o = new Fl_Box(265, 460, 190, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    sourceview_panel->size_range(384, 120);
    sourceview_panel->end();
  } // Fl_Double_Window* sourceview_panel
  return sourceview_panel;
}